

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

ostream * __thiscall wasm::operator<<(wasm *this,ostream *os,Signature sig)

{
  ostream *poVar1;
  undefined1 local_b0 [96];
  bool local_50;
  _Any_data local_48;
  _Manager_type local_38;
  undefined1 local_28 [8];
  Signature sig_local;
  
  sig_local.params = sig.params.id;
  local_28 = (undefined1  [8])os;
  anon_unknown_0::TypePrinter::TypePrinter((TypePrinter *)local_b0,(ostream *)this);
  poVar1 = anon_unknown_0::TypePrinter::print((TypePrinter *)local_b0,(Signature *)local_28);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50 == true) {
    local_50 = false;
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x28));
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Signature sig) {
  return TypePrinter(os).print(sig);
}